

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::Destroy(Regexp *this)

{
  Regexp *pRVar1;
  Regexp *pRVar2;
  bool bVar3;
  ostream *poVar4;
  LogMessage *this_00;
  Regexp *in_RDI;
  Regexp *sub;
  int i;
  Regexp **subs;
  Regexp *re;
  Regexp *stack;
  Regexp *in_stack_fffffffffffffe08;
  Regexp *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  LogMessage *in_stack_fffffffffffffe50;
  Regexp *in_stack_fffffffffffffe60;
  Regexp *in_stack_ffffffffffffffb0;
  Regexp *local_10;
  
  bVar3 = QuickDestroy(in_stack_fffffffffffffe08);
  if (!bVar3) {
    in_RDI->down_ = (Regexp *)0x0;
    local_10 = in_RDI;
    while (pRVar2 = local_10, local_10 != (Regexp *)0x0) {
      pRVar1 = local_10->down_;
      if (local_10->ref_ != 0) {
        LogMessage::LogMessage
                  (in_stack_fffffffffffffe50,
                   (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                   (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
        poVar4 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe68);
        this_00 = (LogMessage *)std::operator<<(poVar4,"Bad reference count ");
        std::ostream::operator<<(this_00,local_10->ref_);
        LogMessage::~LogMessage(this_00);
      }
      if (local_10->nsub_ != 0) {
        in_stack_fffffffffffffe50 = (LogMessage *)Regexp::sub(local_10);
        local_10 = pRVar1;
        for (in_stack_fffffffffffffe4c = 0; in_stack_fffffffffffffe4c < (int)(uint)pRVar2->nsub_;
            in_stack_fffffffffffffe4c = in_stack_fffffffffffffe4c + 1) {
          in_stack_fffffffffffffe40 =
               *(Regexp **)
                (&in_stack_fffffffffffffe50->flushed_ + (long)in_stack_fffffffffffffe4c * 8);
          if (in_stack_fffffffffffffe40 != (Regexp *)0x0) {
            if (in_stack_fffffffffffffe40->ref_ == 0xffff) {
              Decref(in_stack_fffffffffffffe60);
            }
            else {
              in_stack_fffffffffffffe40->ref_ = in_stack_fffffffffffffe40->ref_ - 1;
            }
            if ((in_stack_fffffffffffffe40->ref_ == 0) &&
               (bVar3 = QuickDestroy(in_stack_fffffffffffffe08), !bVar3)) {
              in_stack_fffffffffffffe40->down_ = local_10;
              local_10 = in_stack_fffffffffffffe40;
            }
          }
        }
        if ((1 < pRVar2->nsub_) && (in_stack_fffffffffffffe50 != (LogMessage *)0x0)) {
          operator_delete__(in_stack_fffffffffffffe50);
        }
        pRVar2->nsub_ = 0;
        pRVar1 = local_10;
      }
      local_10 = pRVar1;
      if (pRVar2 != (Regexp *)0x0) {
        ~Regexp(in_stack_ffffffffffffffb0);
        operator_delete(pRVar2);
      }
    }
  }
  return;
}

Assistant:

void Regexp::Destroy() {
  if (QuickDestroy())
    return;

  // Handle recursive Destroy with explicit stack
  // to avoid arbitrarily deep recursion on process stack [sigh].
  down_ = NULL;
  Regexp* stack = this;
  while (stack != NULL) {
    Regexp* re = stack;
    stack = re->down_;
    if (re->ref_ != 0)
      LOG(DFATAL) << "Bad reference count " << re->ref_;
    if (re->nsub_ > 0) {
      Regexp** subs = re->sub();
      for (int i = 0; i < re->nsub_; i++) {
        Regexp* sub = subs[i];
        if (sub == NULL)
          continue;
        if (sub->ref_ == kMaxRef)
          sub->Decref();
        else
          --sub->ref_;
        if (sub->ref_ == 0 && !sub->QuickDestroy()) {
          sub->down_ = stack;
          stack = sub;
        }
      }
      if (re->nsub_ > 1)
        delete[] subs;
      re->nsub_ = 0;
    }
    delete re;
  }
}